

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::BeginDragDropSource(ImGuiDragDropFlags flags)

{
  ImGuiItemStatusFlags *pIVar1;
  float fVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  ImGuiID id;
  value_type_conflict5 *pvVar7;
  ImGuiID IVar8;
  uint uVar9;
  ImGuiWindow *this;
  ImVec2 IVar10;
  ImVec4 local_38;
  
  pIVar4 = GImGui;
  if ((flags & 0x10U) == 0) {
    this = GImGui->CurrentWindow;
    id = (this->DC).LastItemId;
    if (id == 0) {
      if ((GImGui->IO).MouseDown[0] != false) {
        if ((flags & 8U) == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                        ,0x3361,"bool ImGui::BeginDragDropSource(ImGuiDragDropFlags)");
        }
        uVar9 = (this->DC).LastItemStatusFlags;
        if (((uVar9 & 1) != 0) || ((GImGui->ActiveId != 0 && (GImGui->ActiveIdWindow == this)))) {
          uVar9 = uVar9 & 1;
          id = ImGuiWindow::GetIDFromRectangle(this,&(this->DC).LastItemRect);
          (this->DC).LastItemId = id;
          if ((uVar9 != 0) && (SetHoveredID(id), (pIVar4->IO).MouseClicked[0] == true)) {
            SetActiveID(id,this);
            FocusWindow(this);
          }
          if (pIVar4->ActiveId == id) {
            pIVar4->ActiveIdAllowOverlap = SUB41(uVar9,0);
            goto LAB_0018c508;
          }
        }
      }
    }
    else if ((GImGui->ActiveId == id) && ((GImGui->IO).MouseDown[0] != false)) {
LAB_0018c508:
      pvVar7 = ImVector<unsigned_int>::back(&this->IDStack);
      if (((GImGui->IO).MouseDown[0] != false) &&
         (fVar2 = (GImGui->IO).MouseDragThreshold,
         fVar2 * fVar2 <= (GImGui->IO).MouseDragMaxDistanceSqr[0])) {
        IVar8 = *pvVar7;
        goto LAB_0018c3a4;
      }
    }
    bVar6 = false;
  }
  else {
    this = (ImGuiWindow *)0x0;
    id = ImHash("#SourceExtern",0,0);
    IVar8 = 0;
LAB_0018c3a4:
    if (pIVar4->DragDropActive == false) {
      if (id == 0) {
        __assert_fail("source_id != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                      ,0x3387,"bool ImGui::BeginDragDropSource(ImGuiDragDropFlags)");
      }
      ClearDragDrop();
      (pIVar4->DragDropPayload).SourceId = id;
      (pIVar4->DragDropPayload).SourceParentId = IVar8;
      pIVar4->DragDropActive = true;
      pIVar4->DragDropSourceFlags = flags;
      pIVar4->DragDropMouseButton = 0;
    }
    pIVar5 = GImGui;
    if ((flags & 1U) == 0) {
      fVar2 = (pIVar4->Style).MouseCursorScale;
      IVar3 = (pIVar4->IO).MousePos;
      IVar10.x = IVar3.x + fVar2 * 16.0;
      IVar10.y = IVar3.y + fVar2 * 8.0;
      (GImGui->NextWindowData).PosVal = IVar10;
      (pIVar5->NextWindowData).PosPivotVal.x = 0.0;
      (pIVar5->NextWindowData).PosPivotVal.y = 0.0;
      (pIVar5->NextWindowData).PosCond = 1;
      local_38.w = (pIVar5->Style).Colors[4].w * 0.6;
      local_38.x = (pIVar5->Style).Colors[4].x;
      local_38.y = (pIVar5->Style).Colors[4].y;
      local_38.z = (pIVar5->Style).Colors[4].z;
      PushStyleColor(4,&local_38);
      BeginTooltip();
    }
    bVar6 = true;
    if ((flags & 0x12U) == 0) {
      pIVar1 = &(this->DC).LastItemStatusFlags;
      *(byte *)pIVar1 = (byte)*pIVar1 & 0xfe;
    }
  }
  return bVar6;
}

Assistant:

bool ImGui::BeginDragDropSource(ImGuiDragDropFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    bool source_drag_active = false;
    ImGuiID source_id = 0;
    ImGuiID source_parent_id = 0;
    int mouse_button = 0;
    if (!(flags & ImGuiDragDropFlags_SourceExtern))
    {
        source_id = window->DC.LastItemId;
        if (source_id != 0 && g.ActiveId != source_id) // Early out for most common case
            return false;
        if (g.IO.MouseDown[mouse_button] == false)
            return false;

        if (source_id == 0)
        {
            // If you want to use BeginDragDropSource() on an item with no unique identifier for interaction, such as Text() or Image(), you need to:
            // A) Read the explanation below, B) Use the ImGuiDragDropFlags_SourceAllowNullID flag, C) Swallow your programmer pride.
            if (!(flags & ImGuiDragDropFlags_SourceAllowNullID))
            {
                IM_ASSERT(0);
                return false;
            }

            // Magic fallback (=somehow reprehensible) to handle items with no assigned ID, e.g. Text(), Image()
            // We build a throwaway ID based on current ID stack + relative AABB of items in window.
            // THE IDENTIFIER WON'T SURVIVE ANY REPOSITIONING OF THE WIDGET, so if your widget moves your dragging operation will be canceled.
            // We don't need to maintain/call ClearActiveID() as releasing the button will early out this function and trigger !ActiveIdIsAlive.
            bool is_hovered = (window->DC.LastItemStatusFlags & ImGuiItemStatusFlags_HoveredRect) != 0;
            if (!is_hovered && (g.ActiveId == 0 || g.ActiveIdWindow != window))
                return false;
            source_id = window->DC.LastItemId = window->GetIDFromRectangle(window->DC.LastItemRect);
            if (is_hovered)
                SetHoveredID(source_id);
            if (is_hovered && g.IO.MouseClicked[mouse_button])
            {
                SetActiveID(source_id, window);
                FocusWindow(window);
            }
            if (g.ActiveId == source_id) // Allow the underlying widget to display/return hovered during the mouse release frame, else we would get a flicker.
                g.ActiveIdAllowOverlap = is_hovered;
        }
        if (g.ActiveId != source_id)
            return false;
        source_parent_id = window->IDStack.back();
        source_drag_active = IsMouseDragging(mouse_button);
    }
    else
    {
        window = NULL;
        source_id = ImHash("#SourceExtern", 0);
        source_drag_active = true;
    }

    if (source_drag_active)
    {
        if (!g.DragDropActive)
        {
            IM_ASSERT(source_id != 0);
            ClearDragDrop();
            ImGuiPayload& payload = g.DragDropPayload;
            payload.SourceId = source_id;
            payload.SourceParentId = source_parent_id;
            g.DragDropActive = true;
            g.DragDropSourceFlags = flags;
            g.DragDropMouseButton = mouse_button;
        }

        if (!(flags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
        {
            // FIXME-DRAG
            //SetNextWindowPos(g.IO.MousePos - g.ActiveIdClickOffset - g.Style.WindowPadding);
            //PushStyleVar(ImGuiStyleVar_Alpha, g.Style.Alpha * 0.60f); // This is better but e.g ColorButton with checkboard has issue with transparent colors :(

            // The default tooltip position is a little offset to give space to see the context menu (it's also clamped within the current viewport/monitor)
            // In the context of a dragging tooltip we try to reduce that offset and we enforce following the cursor.
            ImVec2 tooltip_pos = g.IO.MousePos + ImVec2(16 * g.Style.MouseCursorScale, 8 * g.Style.MouseCursorScale);
            SetNextWindowPos(tooltip_pos);
            PushStyleColor(ImGuiCol_PopupBg, GetStyleColorVec4(ImGuiCol_PopupBg) * ImVec4(1.0f, 1.0f, 1.0f, 0.6f));
            BeginTooltip();
        }

        if (!(flags & ImGuiDragDropFlags_SourceNoDisableHover) && !(flags & ImGuiDragDropFlags_SourceExtern))
            window->DC.LastItemStatusFlags &= ~ImGuiItemStatusFlags_HoveredRect;

        return true;
    }
    return false;
}